

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Convolution::~Convolution(Convolution *this)

{
  if (this->m_ip != (int *)0x0) {
    operator_delete__(this->m_ip);
  }
  if (this->m_work != (double *)0x0) {
    operator_delete__(this->m_work);
  }
  if (this->m_filter != (double *)0x0) {
    operator_delete__(this->m_filter);
  }
  if (this->m_fft_buff != (double *)0x0) {
    operator_delete__(this->m_fft_buff);
  }
  if (this->m_filter_result != (double *)0x0) {
    operator_delete__(this->m_filter_result);
    return;
  }
  return;
}

Assistant:

~Convolution()
	{
		delete [] m_ip;
		delete [] m_work;
		delete [] m_filter;
		delete [] m_fft_buff;
		delete [] m_filter_result;
	}